

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

uint stb_adler32(uint adler32,uchar *buffer,uint buflen)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  unsigned_long i;
  unsigned_long blocklen;
  unsigned_long s2;
  unsigned_long s1;
  unsigned_long ADLER_MOD;
  uint buflen_local;
  uchar *buffer_local;
  uint adler32_local;
  
  s1 = (unsigned_long)(adler32 & 0xffff);
  s2 = (unsigned_long)(adler32 >> 0x10);
  blocklen = (ulong)buflen % 0x15b0;
  buffer_local = buffer;
  for (buflen_local = buflen; buflen_local != 0; buflen_local = buflen_local - iVar1) {
    for (i = 0; i + 7 < blocklen; i = i + 8) {
      lVar2 = *buffer_local + s1;
      lVar3 = (ulong)buffer_local[1] + lVar2;
      lVar4 = (ulong)buffer_local[2] + lVar3;
      lVar5 = (ulong)buffer_local[3] + lVar4;
      lVar6 = (ulong)buffer_local[4] + lVar5;
      lVar7 = (ulong)buffer_local[5] + lVar6;
      lVar8 = (ulong)buffer_local[6] + lVar7;
      s1 = (ulong)buffer_local[7] + lVar8;
      s2 = s1 + lVar8 + lVar7 + lVar6 + lVar5 + lVar4 + lVar3 + lVar2 + s2;
      buffer_local = buffer_local + 8;
    }
    for (; i < blocklen; i = i + 1) {
      s1 = *buffer_local + s1;
      s2 = s1 + s2;
      buffer_local = buffer_local + 1;
    }
    s1 = s1 % 0xfff1;
    s2 = s2 % 0xfff1;
    iVar1 = (int)blocklen;
    blocklen = 0x15b0;
  }
  return (int)(s2 << 0x10) + (int)s1;
}

Assistant:

static unsigned int stb_adler32(unsigned int adler32, unsigned char *buffer, unsigned int buflen)
{
    const unsigned long ADLER_MOD = 65521;
    unsigned long s1 = adler32 & 0xffff, s2 = adler32 >> 16;
    unsigned long blocklen = buflen % 5552;

    unsigned long i;
    while (buflen) {
        for (i=0; i + 7 < blocklen; i += 8) {
            s1 += buffer[0], s2 += s1;
            s1 += buffer[1], s2 += s1;
            s1 += buffer[2], s2 += s1;
            s1 += buffer[3], s2 += s1;
            s1 += buffer[4], s2 += s1;
            s1 += buffer[5], s2 += s1;
            s1 += buffer[6], s2 += s1;
            s1 += buffer[7], s2 += s1;

            buffer += 8;
        }

        for (; i < blocklen; ++i)
            s1 += *buffer++, s2 += s1;

        s1 %= ADLER_MOD, s2 %= ADLER_MOD;
        buflen -= blocklen;
        blocklen = 5552;
    }
    return (unsigned int)(s2 << 16) + (unsigned int)s1;
}